

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
::Visit<google::protobuf::DescriptorProto>
          (VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  int iVar1;
  EnumDescriptor *descriptor_00;
  EnumDescriptorProto *proto_00;
  OneofDescriptor *descriptor_01;
  OneofDescriptorProto *proto_01;
  FieldDescriptor *pFVar2;
  FieldDescriptorProto *pFVar3;
  Descriptor *descriptor_02;
  DescriptorProto *proto_02;
  ExtensionRange *descriptor_03;
  DescriptorProto_ExtensionRange *proto_03;
  undefined4 local_38;
  undefined4 local_34;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *descriptor_local;
  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
  *this_local;
  
  compiler::CommandLineInterface::Run(int,char_const*const*)::$_1::operator()(this,descriptor,proto)
  ;
  i_2 = 0;
  while( true ) {
    iVar1 = Descriptor::enum_type_count(descriptor);
    if (iVar1 <= i_2) break;
    descriptor_00 = Descriptor::enum_type(descriptor,i_2);
    proto_00 = enum_type(this,proto,i_2);
    Visit<google::protobuf::EnumDescriptorProto>(this,descriptor_00,proto_00);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar1 = Descriptor::oneof_decl_count(descriptor);
    if (iVar1 <= i_3) break;
    descriptor_01 = Descriptor::oneof_decl(descriptor,i_3);
    proto_01 = oneof_decl(this,proto,i_3);
    Visit<google::protobuf::OneofDescriptorProto>(this,descriptor_01,proto_01);
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(descriptor);
    if (iVar1 <= i_4) break;
    pFVar2 = Descriptor::field(descriptor,i_4);
    pFVar3 = field(this,proto,i_4);
    Visit<google::protobuf::FieldDescriptorProto>(this,pFVar2,pFVar3);
    i_4 = i_4 + 1;
  }
  i_5 = 0;
  while( true ) {
    iVar1 = Descriptor::nested_type_count(descriptor);
    if (iVar1 <= i_5) break;
    descriptor_02 = Descriptor::nested_type(descriptor,i_5);
    proto_02 = nested_type(this,proto,i_5);
    Visit<google::protobuf::DescriptorProto>(this,descriptor_02,proto_02);
    i_5 = i_5 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Descriptor::extension_count(descriptor);
    if (iVar1 <= local_34) break;
    pFVar2 = Descriptor::extension(descriptor,local_34);
    pFVar3 = extension(this,proto,local_34);
    Visit<google::protobuf::FieldDescriptorProto>(this,pFVar2,pFVar3);
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while( true ) {
    iVar1 = Descriptor::extension_range_count(descriptor);
    if (iVar1 <= local_38) break;
    descriptor_03 = Descriptor::extension_range(descriptor,local_38);
    proto_03 = extension_range(this,proto,local_38);
    Visit<google::protobuf::DescriptorProto_ExtensionRange>(this,descriptor_03,proto_03);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }